

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall
soplex::SVSetBase<double>::updateUnusedMemEstimation(SVSetBase<double> *this,int change)

{
  DLPSV *pDVar1;
  DLPSV *pDVar2;
  int iVar3;
  int iVar4;
  DLPSV *pDVar5;
  
  iVar3 = this->numUnusedMemUpdates;
  iVar4 = change + this->unusedMem;
  this->unusedMem = iVar4;
  this->numUnusedMemUpdates = iVar3 + 1;
  if ((-1 < iVar4) &&
     (iVar3 < 999999 && iVar4 <= (this->super_ClassArray<soplex::Nonzero<double>_>).thesize)) {
    return;
  }
  iVar3 = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
  this->unusedMem = iVar3;
  pDVar1 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
  pDVar2 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
  while (pDVar5 = pDVar2, pDVar5 != (DLPSV *)0x0) {
    iVar3 = iVar3 - (pDVar5->super_SVectorBase<double>).memused;
    this->unusedMem = iVar3;
    pDVar2 = (DLPSV *)0x0;
    if (pDVar1 != pDVar5) {
      pDVar2 = pDVar5->thenext;
    }
  }
  this->numUnusedMemUpdates = 0;
  return;
}

Assistant:

void updateUnusedMemEstimation(int change)
   {
      unusedMem += change;
      numUnusedMemUpdates++;

      if(unusedMem < 0 || unusedMem > memSize() || numUnusedMemUpdates >= 1000000)
         countUnusedMem();
   }